

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O0

utp_socket_impl * __thiscall
libtorrent::aux::utp_socket_manager::new_utp_socket(utp_socket_manager *this,utp_stream *str)

{
  unsigned_short *__args_1;
  long lVar1;
  pointer puVar2;
  utp_socket_impl *ret;
  __single_object impl;
  undefined1 auStack_18 [4];
  uint16_t recv_id;
  uint16_t send_id;
  utp_stream *str_local;
  utp_socket_manager *this_local;
  
  impl._M_t.
  super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl._6_2_ = 0;
  impl._M_t.
  super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl._4_2_ = 0;
  _auStack_18 = str;
  str_local = (utp_stream *)this;
  if (this->m_new_connection == -1) {
    lVar1 = random((aux *)0xffff);
    impl._M_t.
    super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl._6_2_ =
         (short)lVar1;
    impl._M_t.
    super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl._4_2_ =
         impl._M_t.
         super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
         .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl._6_2_ + -1;
  }
  else {
    impl._M_t.
    super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl._6_2_ =
         (short)this->m_new_connection;
    impl._M_t.
    super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl._4_2_ =
         (short)this->m_new_connection + 1;
    this->m_new_connection = -1;
  }
  __args_1 = (unsigned_short *)
             ((long)&impl._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                     .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl
             + 4);
  ::std::
  make_unique<libtorrent::aux::utp_socket_impl,unsigned_short&,unsigned_short&,libtorrent::aux::utp_stream*&,libtorrent::aux::utp_socket_manager&>
            ((unsigned_short *)&ret,__args_1,
             (utp_stream **)
             ((long)&impl._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                     .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl
             + 6),(utp_socket_manager *)auStack_18);
  puVar2 = ::std::
           unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
           ::get((unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                  *)&ret);
  ::std::
  multimap<unsigned_short,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
  ::
  emplace<unsigned_short&,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>
            ((multimap<unsigned_short,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
              *)&this->m_utp_sockets,__args_1,
             (unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
              *)&ret);
  ::std::
  unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  ::~unique_ptr((unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                 *)&ret);
  return puVar2;
}

Assistant:

utp_socket_impl* utp_socket_manager::new_utp_socket(utp_stream* str)
	{
		std::uint16_t send_id = 0;
		std::uint16_t recv_id = 0;
		if (m_new_connection != -1)
		{
			send_id = std::uint16_t(m_new_connection);
			recv_id = std::uint16_t(m_new_connection + 1);
			m_new_connection = -1;
		}
		else
		{
			send_id = std::uint16_t(random(0xffff));
			recv_id = send_id - 1;
		}
		auto impl = std::make_unique<utp_socket_impl>(recv_id, send_id, str, *this);
		auto* const ret = impl.get();
		m_utp_sockets.emplace(recv_id, std::move(impl));
		return ret;
	}